

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbolNoPlaceholder
          (DescriptorBuilder *this,string *name,string *relative_to,ResolveMode resolve_mode,
          bool build_it)

{
  size_type sVar1;
  uint uVar2;
  Symbol SVar3;
  long lVar4;
  ulong uVar5;
  string scope_to_try;
  string first_part_of_name;
  
  this->possible_undeclared_dependency_ = (FileDescriptor *)0x0;
  (this->undefine_resolved_name_)._M_string_length = 0;
  *(this->undefine_resolved_name_)._M_dataplus._M_p = '\0';
  if ((name->_M_string_length == 0) || (*(name->_M_dataplus)._M_p != '.')) {
    lVar4 = std::__cxx11::string::find((char)name,0x2e);
    first_part_of_name._M_dataplus._M_p = (pointer)&first_part_of_name.field_2;
    first_part_of_name._M_string_length = 0;
    first_part_of_name.field_2._M_local_buf[0] = '\0';
    if (lVar4 == -1) {
      std::__cxx11::string::_M_assign((string *)&first_part_of_name);
    }
    else {
      std::__cxx11::string::substr((ulong)&scope_to_try,(ulong)name);
      std::__cxx11::string::operator=((string *)&first_part_of_name,(string *)&scope_to_try);
      std::__cxx11::string::~string((string *)&scope_to_try);
    }
    std::__cxx11::string::string((string *)&scope_to_try,(string *)relative_to);
    while( true ) {
      uVar5 = std::__cxx11::string::rfind((char)&scope_to_try,0x2e);
      if (uVar5 == 0xffffffffffffffff) break;
      std::__cxx11::string::erase((ulong)&scope_to_try,uVar5);
      sVar1 = scope_to_try._M_string_length;
      std::__cxx11::string::append((ulong)&scope_to_try,'\x01');
      std::__cxx11::string::append((string *)&scope_to_try);
      SVar3 = FindSymbol(this,&scope_to_try,build_it);
      if ((SVar3.ptr_ != (SymbolBase *)0x0) && ((SVar3.ptr_)->symbol_type_ != 0)) {
        uVar2 = (uint)(SVar3.ptr_)->symbol_type_;
        if (first_part_of_name._M_string_length < name->_M_string_length) {
          if ((uVar2 < 10) && ((0x292U >> (uVar2 & 0x1f) & 1) != 0)) {
            std::__cxx11::string::append
                      ((string *)&scope_to_try,(ulong)name,first_part_of_name._M_string_length);
            SVar3 = FindSymbol(this,&scope_to_try,build_it);
            if ((SVar3.ptr_ == (SymbolBase *)0x0) || ((SVar3.ptr_)->symbol_type_ == '\0')) {
              std::__cxx11::string::_M_assign((string *)&this->undefine_resolved_name_);
            }
            goto LAB_00360439;
          }
        }
        else if (((resolve_mode != LOOKUP_TYPES) || (uVar2 == 1)) || (uVar2 == 4))
        goto LAB_00360439;
      }
      std::__cxx11::string::erase((ulong)&scope_to_try,sVar1);
    }
    SVar3 = FindSymbol(this,name,build_it);
LAB_00360439:
    std::__cxx11::string::~string((string *)&scope_to_try);
  }
  else {
    std::__cxx11::string::substr((ulong)&first_part_of_name,(ulong)name);
    SVar3 = FindSymbol(this,&first_part_of_name,build_it);
  }
  std::__cxx11::string::~string((string *)&first_part_of_name);
  return (Symbol)SVar3.ptr_;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbolNoPlaceholder(
    const std::string& name, const std::string& relative_to,
    ResolveMode resolve_mode, bool build_it) {
  possible_undeclared_dependency_ = nullptr;
  undefine_resolved_name_.clear();

  if (!name.empty() && name[0] == '.') {
    // Fully-qualified name.
    return FindSymbol(name.substr(1), build_it);
  }

  // If name is something like "Foo.Bar.baz", and symbols named "Foo" are
  // defined in multiple parent scopes, we only want to find "Bar.baz" in the
  // innermost one.  E.g., the following should produce an error:
  //   message Bar { message Baz {} }
  //   message Foo {
  //     message Bar {
  //     }
  //     optional Bar.Baz baz = 1;
  //   }
  // So, we look for just "Foo" first, then look for "Bar.baz" within it if
  // found.
  std::string::size_type name_dot_pos = name.find_first_of('.');
  std::string first_part_of_name;
  if (name_dot_pos == std::string::npos) {
    first_part_of_name = name;
  } else {
    first_part_of_name = name.substr(0, name_dot_pos);
  }

  std::string scope_to_try(relative_to);

  while (true) {
    // Chop off the last component of the scope.
    std::string::size_type dot_pos = scope_to_try.find_last_of('.');
    if (dot_pos == std::string::npos) {
      return FindSymbol(name, build_it);
    } else {
      scope_to_try.erase(dot_pos);
    }

    // Append ".first_part_of_name" and try to find.
    std::string::size_type old_size = scope_to_try.size();
    scope_to_try.append(1, '.');
    scope_to_try.append(first_part_of_name);
    Symbol result = FindSymbol(scope_to_try, build_it);
    if (!result.IsNull()) {
      if (first_part_of_name.size() < name.size()) {
        // name is a compound symbol, of which we only found the first part.
        // Now try to look up the rest of it.
        if (result.IsAggregate()) {
          scope_to_try.append(name, first_part_of_name.size(),
                              name.size() - first_part_of_name.size());
          result = FindSymbol(scope_to_try, build_it);
          if (result.IsNull()) {
            undefine_resolved_name_ = scope_to_try;
          }
          return result;
        } else {
          // We found a symbol but it's not an aggregate.  Continue the loop.
        }
      } else {
        if (resolve_mode == LOOKUP_TYPES && !result.IsType()) {
          // We found a symbol but it's not a type.  Continue the loop.
        } else {
          return result;
        }
      }
    }

    // Not found.  Remove the name so we can try again.
    scope_to_try.erase(old_size);
  }
}